

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O2

Table * __thiscall
Heuristics::popFromFrontierBestFirst(Table *__return_storage_ptr__,Heuristics *this)

{
  int iVar1;
  pointer pTVar2;
  pointer pTVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  pointer pTVar7;
  int iVar8;
  ulong in_R9;
  
  Table::Table(__return_storage_ptr__);
  pTVar3 = (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar8 = 1000;
  uVar6 = 0;
  pTVar2 = (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pTVar7 = pTVar2; pTVar7 != pTVar3; pTVar7 = pTVar7 + 1) {
    iVar1 = pTVar7->evaluationScore;
    if (iVar1 <= iVar8) {
      uVar4 = *(undefined8 *)pTVar7->table;
      uVar5 = *(undefined8 *)(pTVar7->table[2] + 2);
      __return_storage_ptr__->current_col = pTVar7->current_col;
      *(undefined8 *)__return_storage_ptr__->table = uVar4;
      *(undefined8 *)(__return_storage_ptr__->table[2] + 2) = uVar5;
      __return_storage_ptr__->evaluationScore = iVar1;
      in_R9 = uVar6;
      iVar8 = iVar1;
    }
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  std::vector<Table,_std::allocator<Table>_>::erase(&this->evaluatedChildren,pTVar2 + (int)in_R9);
  return __return_storage_ptr__;
}

Assistant:

Table Heuristics::popFromFrontierBestFirst() {
    Table bestNextState;
    int score = 1000;
    int positionOfBest;
    int position = 0;
    for (Table table : evaluatedChildren) {
        if (table.evaluationScore <= score) {
            score = table.evaluationScore;
            positionOfBest = position;
            bestNextState = table;
        }
        position++;
    }
    evaluatedChildren.erase(evaluatedChildren.begin()+positionOfBest);
    return bestNextState;
}